

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handler_goesr.cc
# Opt level: O0

bool __thiscall
GOESRProduct::matchProduct
          (GOESRProduct *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *products)

{
  bool bVar1;
  reference pbVar2;
  ulong uVar3;
  char *pcVar4;
  undefined8 in_RSI;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *in_RDI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *product;
  const_iterator __end1;
  const_iterator __begin1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1;
  bool performed_negative_check;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  it;
  const_iterator end;
  const_iterator begin;
  undefined7 in_stack_ffffffffffffff68;
  byte in_stack_ffffffffffffff6f;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff78;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  in_stack_ffffffffffffff80;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  in_stack_ffffffffffffff88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff90;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_58;
  undefined8 local_50;
  byte local_41;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_40;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_38;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_30;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_28;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_20;
  undefined8 local_18;
  bool local_1;
  
  local_18 = in_RSI;
  bVar1 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::empty((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)in_stack_ffffffffffffff80._M_current);
  if (bVar1) {
    local_1 = true;
  }
  else {
    local_20 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               std::begin<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                         ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)CONCAT17(in_stack_ffffffffffffff6f,in_stack_ffffffffffffff68));
    local_40 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               std::end<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                         ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)CONCAT17(in_stack_ffffffffffffff6f,in_stack_ffffffffffffff68));
    local_38 = local_20;
    local_28 = local_40;
    local_30 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               std::
               find<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,std::__cxx11::string>
                         (in_stack_ffffffffffffff88,in_stack_ffffffffffffff80,
                          in_stack_ffffffffffffff78);
    bVar1 = __gnu_cxx::operator!=
                      (in_RDI,(__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                               *)CONCAT17(in_stack_ffffffffffffff6f,in_stack_ffffffffffffff68));
    if (bVar1) {
      local_1 = true;
    }
    else {
      local_41 = 0;
      local_50 = local_18;
      local_58._M_current =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)CONCAT17(in_stack_ffffffffffffff6f,in_stack_ffffffffffffff68));
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)CONCAT17(in_stack_ffffffffffffff6f,in_stack_ffffffffffffff68));
      while (bVar1 = __gnu_cxx::operator!=
                               (in_RDI,(__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                        *)CONCAT17(in_stack_ffffffffffffff6f,
                                                   in_stack_ffffffffffffff68)), bVar1) {
        pbVar2 = __gnu_cxx::
                 __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator*(&local_58);
        uVar3 = std::__cxx11::string::empty();
        if (((uVar3 & 1) == 0) &&
           (pcVar4 = (char *)std::__cxx11::string::at((ulong)pbVar2), *pcVar4 == '^')) {
          local_41 = 1;
          std::__cxx11::string::substr((ulong)&stack0xffffffffffffff78,(ulong)pbVar2);
          in_stack_ffffffffffffff6f =
               std::operator==(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88._M_current);
          std::__cxx11::string::~string((string *)&stack0xffffffffffffff78);
          if ((in_stack_ffffffffffffff6f & 1) != 0) {
            return false;
          }
        }
        __gnu_cxx::
        __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::operator++(&local_58);
      }
      local_1 = (bool)(local_41 & 1);
    }
  }
  return local_1;
}

Assistant:

bool GOESRProduct::matchProduct(const std::vector<std::string>& products) const {
  if (products.empty()) {
    return true;
  }

  // Check for a positive match.
  const auto begin = std::begin(products);
  const auto end = std::end(products);
  const auto it = std::find(begin, end, product_.nameShort);
  if (it != end) {
    return true;
  }

  // Check for a negative match.
  bool performed_negative_check = false;
  for (const auto& product : products) {
    if (product.empty() || product.at(0) != '^') {
      continue;
    }
    // Compare the sub-string after the negation character.
    performed_negative_check = true;
    if (product.substr(1) == product_.nameShort) {
      return false;
    }
  }

  return performed_negative_check;
}